

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

int SUNNonlinSolSetMaxIters_Newton(SUNNonlinearSolver NLS,int maxiters)

{
  if (NLS == (SUNNonlinearSolver)0x0) {
    return -0x385;
  }
  if (0 < maxiters) {
    *(int *)((long)NLS->content + 0x30) = maxiters;
    return 0;
  }
  return -0x387;
}

Assistant:

int SUNNonlinSolSetMaxIters_Newton(SUNNonlinearSolver NLS, int maxiters)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check that maxiters is a vaild */
  if (maxiters < 1)
    return(SUN_NLS_ILL_INPUT);

  NEWTON_CONTENT(NLS)->maxiters = maxiters;
  return(SUN_NLS_SUCCESS);
}